

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

int32_t ucstrTextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                        UErrorCode *pErrorCode)

{
  UChar *pUVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint length;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (-1 < destCapacity) {
      if ((start <= limit) && (dest != (UChar *)0x0 || destCapacity == 0)) {
        ucstrTextAccess(ut,start,'\x01');
        uVar2 = ut->chunkOffset;
        uVar3 = (uint)ut->a;
        if ((int)uVar3 < 0) {
          uVar4 = 0x7fffffff;
          if ((ulong)limit < 0x7fffffff) {
            uVar4 = limit;
          }
        }
        else {
          uVar4 = (ulong)(uVar3 & 0x7fffffff);
          if ((ulong)limit <= (ulong)(uVar3 & 0x7fffffff)) {
            uVar4 = limit;
          }
        }
        pUVar1 = ut->chunkContents;
        uVar4 = uVar4 & 0xffffffff;
        if (limit < 0) {
          uVar4 = 0;
        }
        length = (int)uVar4 - uVar2;
        if (length == 0 || (int)uVar4 < (int)uVar2) {
          length = 0;
          uVar4 = (ulong)uVar2;
        }
        else {
          lVar6 = (long)(int)uVar2;
          uVar5 = 0;
          do {
            if (((int)uVar3 < 0) && (pUVar1[lVar6 + uVar5] == L'\0')) {
              length = (uint)uVar5;
              uVar3 = uVar2 + length;
              uVar4 = (ulong)uVar3;
              ut->a = lVar6 + uVar5;
              ut->chunkNativeLimit = lVar6 + uVar5;
              ut->chunkLength = uVar3;
              ut->nativeIndexingLimit = uVar3;
              goto LAB_0018f809;
            }
            if (uVar5 < (uint)destCapacity) {
              dest[uVar5] = pUVar1[lVar6 + uVar5];
            }
            else if (-1 < (int)uVar3) goto LAB_0018f809;
            uVar5 = uVar5 + 1;
          } while (length != uVar5);
          uVar4 = (ulong)((int)uVar5 + uVar2);
        }
LAB_0018f809:
        uVar2 = (uint)uVar4;
        if ((((0 < (int)uVar2) && (uVar2 < uVar3)) && ((pUVar1[uVar4 - 1] & 0xfc00U) == 0xd800)) &&
           ((pUVar1[uVar4] & 0xfc00U) == 0xdc00)) {
          if ((int)length < destCapacity) {
            lVar6 = (long)(int)length;
            length = length + 1;
            dest[lVar6] = pUVar1[uVar4];
          }
          uVar2 = uVar2 + 1;
        }
        if (ut->chunkNativeLimit < (long)(int)uVar2) {
          ucstrTextAccess(ut,(long)(int)uVar2,'\x01');
        }
        else {
          ut->chunkOffset = uVar2;
        }
        u_terminateUChars_63(dest,destCapacity,length,pErrorCode);
        return length;
      }
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

static int32_t U_CALLCONV
ucstrTextExtract(UText *ut,
                  int64_t start, int64_t limit,
                  UChar *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode)
{
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0) || start>limit) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    //const UChar *s=(const UChar *)ut->context;
    int32_t si, di;

    int32_t start32;
    int32_t limit32;

    // Access the start.  Does two things we need:
    //   Pins 'start' to the length of the string, if it came in out-of-bounds.
    //   Snaps 'start' to the beginning of a code point.
    ucstrTextAccess(ut, start, TRUE);
    const UChar *s=ut->chunkContents;
    start32 = ut->chunkOffset;

    int32_t strLength=(int32_t)ut->a;
    if (strLength >= 0) {
        limit32 = pinIndex(limit, strLength);
    } else {
        limit32 = pinIndex(limit, INT32_MAX);
    }
    di = 0;
    for (si=start32; si<limit32; si++) {
        if (strLength<0 && s[si]==0) {
            // Just hit the end of a null-terminated string.
            ut->a = si;               // set string length for this UText
            ut->chunkNativeLimit    = si;
            ut->chunkLength         = si;
            ut->nativeIndexingLimit = si;
            strLength               = si;
            limit32                 = si;
            break;
        }
        U_ASSERT(di>=0); /* to ensure di never exceeds INT32_MAX, which must not happen logically */
        if (di<destCapacity) {
            // only store if there is space.
            dest[di] = s[si];
        } else {
            if (strLength>=0) {
                // We have filled the destination buffer, and the string length is known.
                //  Cut the loop short.  There is no need to scan string termination.
                di = limit32 - start32;
                si = limit32;
                break;
            }
        }
        di++;
    }

    // If the limit index points to a lead surrogate of a pair,
    //   add the corresponding trail surrogate to the destination.
    if (si>0 && U16_IS_LEAD(s[si-1]) &&
            ((si<strLength || strLength<0)  && U16_IS_TRAIL(s[si])))
    {
        if (di<destCapacity) {
            // store only if there is space in the output buffer.
            dest[di++] = s[si];
        }
        si++;
    }

    // Put iteration position at the point just following the extracted text
    if (si <= ut->chunkNativeLimit) {
        ut->chunkOffset = si;
    } else {
        ucstrTextAccess(ut, si, TRUE);
    }

    // Add a terminating NUL if space in the buffer permits,
    // and set the error status as required.
    u_terminateUChars(dest, destCapacity, di, pErrorCode);
    return di;
}